

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

gchar * greetable_skeleton_get_greeting(Greetable *object)

{
  GType GVar1;
  long lVar2;
  gchar *pgVar3;
  
  GVar1 = greetable_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  g_mutex_lock(*(long *)(lVar2 + 0x20) + 0x20);
  pgVar3 = (gchar *)g_value_get_string(**(undefined8 **)(lVar2 + 0x20));
  g_mutex_unlock(*(long *)(lVar2 + 0x20) + 0x20);
  return pgVar3;
}

Assistant:

static const gchar *
greetable_skeleton_get_greeting (Greetable *object)
{
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (object);
  const gchar *value;
  g_mutex_lock (&skeleton->priv->lock);
  value = g_value_get_string (&(skeleton->priv->properties[0]));
  g_mutex_unlock (&skeleton->priv->lock);
  return value;
}